

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int32 smooth_mixw(float32 ****out_mixw,float32 ***mixw_acc_a,float32 ***mixw_acc_b,uint32 n_mixw,
                 uint32 n_feat,uint32 n_gau,model_def_t *mdef)

{
  uint32 n_ci_state;
  uint32 uVar1;
  acmod_set_t *acmod_set;
  model_def_entry_t *pmVar2;
  uint32 *puVar3;
  uint32 *puVar4;
  float32 *pfVar5;
  float *pfVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  uint32 uVar10;
  uint32 uVar11;
  acmod_id_t aVar12;
  cmd_ln_t *pcVar13;
  float64 *dnom;
  float64 *dnom_00;
  float64 *dnom_01;
  float64 *pfVar14;
  uint32 **ci_mixw;
  uint32 **n_tied;
  float32 **lambda;
  float64 **lambda_acc;
  long lVar15;
  uchar *converged;
  ulong uVar16;
  long lVar17;
  char *pcVar18;
  uint uVar19;
  ulong uVar20;
  uint n_cd_state;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  float cilambda;
  double dVar24;
  double dVar25;
  float64 fVar26;
  double dVar27;
  float fVar28;
  undefined8 in_stack_fffffffffffffef8;
  float32 ***pppfVar29;
  undefined8 uVar30;
  undefined4 uVar31;
  uint32 in_stack_ffffffffffffff10;
  
  pcVar13 = cmd_ln_get();
  dVar24 = cmd_ln_float_r(pcVar13,"-cilambda");
  acmod_set = mdef->acmod_set;
  uVar20 = (ulong)mdef->n_tied_state;
  dnom = (float64 *)
         __ckd_calloc__(uVar20,8,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                        ,0xca);
  dnom_00 = (float64 *)
            __ckd_calloc__(uVar20,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                           ,0xcb);
  dnom_01 = (float64 *)
            __ckd_calloc__(uVar20,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                           ,0xcc);
  if (uVar20 != 0) {
    uVar23 = 0;
    do {
      dVar27 = 0.0;
      dVar25 = 0.0;
      if (n_gau != 0) {
        uVar16 = 0;
        do {
          dVar25 = dVar25 + (double)(float)(*mixw_acc_a[uVar23])[uVar16];
          dVar27 = dVar27 + (double)(float)(*mixw_acc_b[uVar23])[uVar16];
          uVar16 = uVar16 + 1;
        } while (n_gau != uVar16);
      }
      if ((dVar25 <= 0.0) || (dVar27 <= 0.0)) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                ,0xdc,"Tied state %u never observed in the training corpus\n",uVar23 & 0xffffffff);
        dnom_01[uVar23] = 0.0;
        dnom_00[uVar23] = 0.0;
        fVar26 = 0.0;
        pfVar14 = dnom;
      }
      else {
        dnom[uVar23] = (float64)(1.0 / dVar25);
        dnom_00[uVar23] = (float64)(1.0 / dVar27);
        fVar26 = (float64)(1.0 / (dVar27 + dVar25));
        pfVar14 = dnom_01;
      }
      pfVar14[uVar23] = fVar26;
      uVar23 = uVar23 + 1;
    } while (uVar23 != uVar20);
  }
  cilambda = (float)dVar24;
  n_ci_state = mdef->n_tied_ci_state;
  uVar1 = mdef->n_tied_state;
  n_cd_state = uVar1 - n_ci_state;
  if (n_cd_state == 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
            ,0xe9,"Only CI states.\n");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
            ,0xea,"    CI PDF == %.2f * CI + %.2f * UNIFORM\n",(double)cilambda,
            1.0 - (double)cilambda);
    accum_3d(mixw_acc_a,mixw_acc_b,n_ci_state,n_feat,n_gau);
    interp_counts_3d_uniform(mixw_acc_a,0,n_ci_state,n_feat,n_gau,(float32)cilambda);
    *out_mixw = mixw_acc_a;
    ckd_free_3d(mixw_acc_b);
  }
  else {
    uVar19 = mdef->max_n_state;
    uVar23 = 0;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
            ,0x105,"Interpolating %u CD states\n",(ulong)n_cd_state);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
            ,0x106,"%u states max/model\n",(ulong)uVar19);
    uVar20 = (ulong)n_cd_state;
    uVar16 = (ulong)(uVar19 + 1);
    ci_mixw = (uint32 **)
              __ckd_calloc_2d__(uVar20,uVar16,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                                ,0x109);
    do {
      if (uVar16 != 0) {
        memset(ci_mixw[uVar23],0xff,uVar16 * 4);
      }
      uVar23 = uVar23 + 1;
    } while (uVar20 != uVar23);
    n_tied = (uint32 **)
             __ckd_calloc_2d__(uVar20,uVar16,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                               ,0x10f);
    if (uVar1 != n_ci_state) {
      uVar23 = 0;
      do {
        if (uVar16 != 0) {
          memset(n_tied[uVar23],0xff,uVar16 * 4);
        }
        uVar23 = uVar23 + 1;
      } while (uVar20 != uVar23);
    }
    uVar10 = acmod_set_n_ci(acmod_set);
    uVar11 = acmod_set_n_acmod(acmod_set);
    uVar31 = (undefined4)((ulong)in_stack_fffffffffffffef8 >> 0x20);
    if (uVar10 < uVar11) {
      pmVar2 = mdef->defn;
      uVar23 = (ulong)uVar10;
      do {
        aVar12 = acmod_set_base_phone(acmod_set,(acmod_id_t)uVar23);
        uVar31 = (undefined4)((ulong)in_stack_fffffffffffffef8 >> 0x20);
        if (pmVar2[uVar23].n_state != 0) {
          puVar3 = pmVar2[uVar23].state;
          uVar16 = 0;
          do {
            uVar21 = puVar3[uVar16];
            if (uVar21 != 0xffffffff && n_ci_state <= uVar21) {
              uVar21 = uVar21 - n_ci_state;
              puVar4 = ci_mixw[uVar21];
              uVar22 = 0;
              if (uVar19 != 0) {
                do {
                  if ((puVar4[uVar22] == 0xffffffff) ||
                     (puVar4[uVar22] == pmVar2[aVar12].state[uVar16])) goto LAB_00103331;
                  uVar22 = uVar22 + 1;
                } while (uVar19 != (uint)uVar22);
                uVar22 = (ulong)uVar19;
LAB_00103331:
                uVar22 = uVar22 & 0xffffffff;
              }
              uVar10 = pmVar2[aVar12].state[uVar16];
              if (puVar4[uVar22] != uVar10) {
                puVar4[uVar22] = uVar10;
                n_tied[uVar21][uVar22] = 0;
              }
              n_tied[uVar21][uVar22] = n_tied[uVar21][uVar22] + 1;
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 < pmVar2[uVar23].n_state);
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 != uVar11);
    }
    lambda = (float32 **)
             __ckd_calloc_2d__(uVar20,3,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                               ,0x139);
    lambda_acc = (float64 **)
                 __ckd_calloc_2d__(uVar20,3,8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                                   ,0x13c);
    if (uVar1 != n_ci_state) {
      uVar23 = 0;
      do {
        pfVar5 = lambda[uVar23];
        pfVar5[2] = 0.6;
        pfVar5[0] = 0.1;
        pfVar5[1] = 0.3;
        uVar23 = uVar23 + 1;
      } while (uVar20 != uVar23);
    }
    pcVar13 = cmd_ln_get();
    lVar15 = cmd_ln_int_r(pcVar13,"-maxiter");
    converged = (uchar *)__ckd_calloc__(uVar20,1,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                                        ,0x148);
    if ((uint)lVar15 == 0) {
      bVar8 = true;
      uVar19 = 0;
      uVar21 = 0;
    }
    else {
      uVar21 = 0;
      uVar19 = 0;
      bVar9 = false;
      do {
        compute_mixw_lambda(lambda,lambda_acc,converged,n_cd_state,n_ci_state,ci_mixw,mixw_acc_b,
                            mixw_acc_a,dnom,in_stack_ffffffffffffff10,n_feat,n_gau);
        pppfVar29 = mixw_acc_a;
        compute_mixw_lambda(lambda,lambda_acc,converged,n_cd_state,n_ci_state,ci_mixw,mixw_acc_a,
                            mixw_acc_b,dnom_00,in_stack_ffffffffffffff10,n_feat,n_gau);
        if (uVar1 != n_ci_state) {
          uVar23 = 0;
          bVar8 = bVar9;
          do {
            if (converged[uVar23] != '\x01') {
              dVar24 = 0.0;
              lVar17 = 0;
              do {
                dVar24 = dVar24 + (double)lambda_acc[uVar23][lVar17];
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
              if (dVar24 <= 1.199999978106707e-38) {
                pfVar5 = lambda[uVar23];
                lVar17 = 0;
                do {
                  pfVar5[lVar17] = 0.33333334;
                  lVar17 = lVar17 + 1;
                } while (lVar17 != 3);
              }
              else {
                pfVar5 = lambda[uVar23];
                pfVar14 = lambda_acc[uVar23];
                bVar7 = true;
                lVar17 = 0;
                do {
                  fVar28 = (float)((double)pfVar14[lVar17] * (1.0 / dVar24));
                  if (0.0001 < ABS((float)pfVar5[lVar17] - fVar28)) {
                    bVar7 = false;
                  }
                  pfVar5[lVar17] = (float32)fVar28;
                  pfVar14[lVar17] = 0.0;
                  lVar17 = lVar17 + 1;
                } while (lVar17 != 3);
                if (!bVar7) goto LAB_0010360a;
              }
              converged[uVar23] = '\x01';
              uVar21 = uVar21 + 1;
              bVar9 = bVar8;
              if (uVar21 == n_cd_state) {
                bVar8 = true;
                bVar9 = true;
              }
            }
LAB_0010360a:
            uVar23 = uVar23 + 1;
          } while (uVar23 != uVar20);
        }
        uVar30 = CONCAT44((int)((ulong)pppfVar29 >> 0x20),n_cd_state);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                ,0x188,"%u:%u:%u\n",(ulong)uVar19,(ulong)uVar21,uVar30);
        uVar31 = (undefined4)((ulong)uVar30 >> 0x20);
        uVar19 = uVar19 + 1;
        bVar8 = !bVar9;
      } while ((uVar19 < (uint)lVar15) && (!bVar9));
    }
    if (bVar8) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
              ,0x18d,"%u of %u states converged after %u iterations.\n",(ulong)uVar21,
              (ulong)n_cd_state,CONCAT44(uVar31,uVar19));
    }
    puts("SUMMARY\n");
    puts(" State  Count A   Count B    Total    CD    CI    UNI   Cnv");
    puts("------ --------- --------- --------- ----- ----- ------ ---");
    if (uVar1 != n_ci_state) {
      uVar23 = 0;
      do {
        uVar16 = (ulong)((int)uVar23 + n_ci_state);
        pfVar6 = (float *)lambda[uVar23];
        pcVar18 = "y";
        if (converged[uVar23] == '\0') {
          pcVar18 = "n";
        }
        printf("%6u %.3e %.3e %.3e %.3f %.3f %.3f %s\n",
               -(ulong)(0.0 < (double)dnom[uVar16]) & (ulong)(1.0 / (double)dnom[uVar16]),
               -(ulong)(0.0 < (double)dnom_00[uVar16]) & (ulong)(1.0 / (double)dnom_00[uVar16]),
               -(ulong)(0.0 < (double)dnom_01[uVar16]) & (ulong)(1.0 / (double)dnom_01[uVar16]),
               (double)pfVar6[2],(double)pfVar6[1],(double)*pfVar6,uVar16,pcVar18);
        uVar23 = uVar23 + 1;
      } while (uVar20 != uVar23);
    }
    interp_mixw(out_mixw,mixw_acc_a,mixw_acc_b,dnom_01,lambda,(float32)cilambda,ci_mixw,n_tied,
                n_cd_state,n_ci_state,n_mixw,n_feat,n_gau);
  }
  return 0;
}

Assistant:

int32
smooth_mixw(float32 ****out_mixw,
	    
	    float32 ***mixw_acc_a,
	    float32 ***mixw_acc_b,

	    uint32 n_mixw,
	    uint32 n_feat,
	    uint32 n_gau,

	    model_def_t *mdef
	    )
{
    uint32 i, j, k;
    uint32 n_base, cd_start, n_phone;
    uint32 n_ci_state;
    uint32 n_cd_state;
    uint32 n_state;
    uint32 max_state_pm;
    float64 *dnom_a;
    float64 *dnom_b;
    float64 *dnom;
    float64 sum_a;
    float64 sum_b;
    float64 sum;
    float32 **lambda;
    float64 **lambda_acc;
    uint32 **ci_mixw;
    uint32 *ci_state;
    uint32 max_iter;
    uint32 tt;
    unsigned char *conv_flag;
    uint32 converged;
    uint32 state_converged;
    acmod_id_t base;
    uint32 iter;
    float64 norm;
    float32 prior_lambda;
    model_def_entry_t *defn;
    float32 cilambda = cmd_ln_float32("-cilambda");
    uint32 n_conv_state;
    uint32 **n_tied;
    acmod_set_t *acmod_set;

    acmod_set = mdef->acmod_set;

    /*
     * Compute normalization factors
     */
    n_state = mdef->n_tied_state;

    dnom_a = (float64 *)ckd_calloc(n_state, sizeof(float64));
    dnom_b = (float64 *)ckd_calloc(n_state, sizeof(float64));
    dnom   = (float64 *)ckd_calloc(n_state, sizeof(float64));

    /* compute the count normalization factor for all tied states */
    for (i = 0; i < n_state; i++) {
	sum_a = sum_b = sum = 0;
	for (k = 0; k < n_gau; k++) {
	    sum_a += mixw_acc_a[i][0][k];
	    sum_b += mixw_acc_b[i][0][k];
	}

	if ((sum_a > 0) && (sum_b > 0)) {
	    dnom_a[i] = 1.0 / sum_a;
	    dnom_b[i] = 1.0 / sum_b;
	    dnom[i] = 1.0 / (sum_a + sum_b);
	}
	else {
	    E_WARN("Tied state %u never observed in the training corpus\n", i);
	    dnom_a[i] = dnom_b[i] = dnom[i] = 0.0;
	}
    }

    /*
     * Interpolate CI states
     */

    n_cd_state = mdef->n_tied_state - mdef->n_tied_ci_state;
    n_ci_state = mdef->n_tied_ci_state;

    if (n_cd_state == 0) {
	E_INFO("Only CI states.\n");
	E_INFO("    CI PDF == %.2f * CI + %.2f * UNIFORM\n", cilambda, (1.0 - cilambda));
    
	/* add together counts for context independent states */
	accum_3d(mixw_acc_a, mixw_acc_b,
		 n_ci_state,	/* run over n_ci_state states */
		 n_feat, n_gau);

	/* interpolate CI distributions with uniform distribution */
	interp_counts_3d_uniform(mixw_acc_a,
				 0,		/* start state */
				 n_ci_state,	/* run length */
				 n_feat, n_gau,
				 cilambda);

	*out_mixw = mixw_acc_a;
	
	ckd_free_3d((void ***)mixw_acc_b);
	
	return S3_SUCCESS;
    }

    /*
     * Interpolate all states
     */

    max_state_pm = mdef->max_n_state;

    E_INFO("Interpolating %u CD states\n", n_cd_state);
    E_INFO("%u states max/model\n", max_state_pm);
    
    ci_mixw = (uint32 **)ckd_calloc_2d(n_cd_state, max_state_pm+1,
				       sizeof(uint32));
    for (i = 0; i < n_cd_state; i++)
	for (j = 0; j < max_state_pm+1; j++)
	    ci_mixw[i][j] = TYING_NO_ID;

    n_tied = (uint32 **)ckd_calloc_2d(n_cd_state, max_state_pm+1,
				      sizeof(uint32));
    for (i = 0; i < n_cd_state; i++)
	for (j = 0; j < max_state_pm+1; j++)
	    n_tied[i][j] = TYING_NO_ID;
    
    cd_start = n_base = acmod_set_n_ci(acmod_set);
    n_phone = acmod_set_n_acmod(acmod_set);

    defn = mdef->defn;
    
    /* for each cd state, find the id's of the associated ci states */
    for (i = cd_start; i < n_phone; i++) {
	base = acmod_set_base_phone(acmod_set, i);
	for (j = 0; j < defn[i].n_state; j++) {
	    if (defn[i].state[j] < n_ci_state) {
		/* This is a ci state, so skip it */

		continue;
	    }

	    if (defn[i].state[j] != TYING_NON_EMITTING) {
		tt = defn[i].state[j] - n_ci_state;

		ci_state = ci_mixw[tt];
		
		for (k = 0; (k < max_state_pm) && (ci_state[k] != TYING_NO_ID); k++) {
		    if (ci_state[k] == defn[base].state[j])
			break;	/* already on list */
		}

		if (ci_state[k] != defn[base].state[j]) {
		    /* not on list, so add */
		    ci_state[k] = defn[base].state[j];
		    n_tied[tt][k] = 0;
		}

		++n_tied[tt][k];	/* # of times CD and CI occur in same state position */
	    }
	}
    }
    
    lambda = (float32 **)ckd_calloc_2d(n_cd_state, N_DIST_TYPE,
					sizeof(float32));
    /* storage is returned zeroed */
    lambda_acc = (float64 **)ckd_calloc_2d(n_cd_state, N_DIST_TYPE,
					   sizeof(float64));

    for (i = 0; i < n_cd_state; i++) {
	/* biased initialization should help generally well trained models
	 * converge faster */
	lambda[i][(int)DIST_CD] = 0.6f;
	lambda[i][(int)DIST_CI] = 0.3f;
	lambda[i][(int)DIST_UNIFORM] = 0.1f;
    }

    max_iter = cmd_ln_int32("-maxiter");

    conv_flag = (unsigned char *)ckd_calloc(n_cd_state, sizeof(unsigned char));

    for (iter = 0, converged = FALSE, n_conv_state = 0;
	 (iter < max_iter) && (!converged);
	 iter++) {

	compute_mixw_lambda(lambda, lambda_acc, conv_flag,
			    n_cd_state, n_ci_state,
			    ci_mixw,
			    mixw_acc_b,
			    mixw_acc_a,
			    dnom_a,
			    n_mixw, n_feat, n_gau);

	compute_mixw_lambda(lambda, lambda_acc, conv_flag,
			    n_cd_state, n_ci_state,
			    ci_mixw,
			    mixw_acc_a,
			    mixw_acc_b,
			    dnom_b,
			    n_mixw, n_feat, n_gau);

	/* update lambdas and check for convergence */
	for (i = 0; i < n_cd_state; i++) {

	    if (conv_flag[i] == TRUE)	/* don't update converged states */
		continue;

	    norm = 0.0;
	    for (j = 0; j < N_DIST_TYPE; j++) {
		norm += lambda_acc[i][j];
	    }

	    if (norm > MIN_IEEE_NORM_POS_FLOAT32) {
		norm = 1.0f / norm;

		for (j = 0, state_converged = TRUE; j < N_DIST_TYPE; j++) {
		    prior_lambda = lambda[i][j];
		    lambda[i][j] = lambda_acc[i][j] * norm;

		    lambda_acc[i][j] = 0.0;

		    if (fabs(prior_lambda - lambda[i][j]) > CON_TH) {
			state_converged = FALSE;
		    }
		}
		    
	    }
	    else {
		for (j = 0; j < N_DIST_TYPE; j++) {
		    lambda[i][j] = 1.0f / N_DIST_TYPE;
		}
		state_converged = TRUE;
	    }
		
	    if (state_converged) {
		conv_flag[i] = TRUE;
		++n_conv_state;
		if (n_conv_state == n_cd_state) {
		    converged = TRUE;
		}
	    }
	}

	E_INFO("%u:%u:%u\n", iter, n_conv_state, n_cd_state);
    }

    if (!converged) {
	E_WARN("%u of %u states converged after %u iterations.\n",
	       n_conv_state, n_cd_state, iter);

    }

    printf("SUMMARY\n\n");
    printf(" State  Count A   Count B    Total    CD    CI    UNI   Cnv\n");
    printf("------ --------- --------- --------- ----- ----- ------ ---\n");
    for (i = 0; i < n_cd_state; i++) {

	j = n_ci_state + i;	/* CD tied state id */

	printf("%6u %.3e %.3e %.3e %.3f %.3f %.3f %s\n",
	       j,
	       (dnom_a[j] > 0 ? 1.0 / dnom_a[j] : 0.0),	/* count of partition A tied state j */
	       (dnom_b[j] > 0 ? 1.0 / dnom_b[j] : 0.0),	/* count of partition B tied state j */
	       (dnom[j] > 0 ? 1.0 / dnom[j] : 0.0),	/* count of partition A+B tied state j */
	       lambda[i][DIST_CD],
	       lambda[i][DIST_CI],
	       lambda[i][DIST_UNIFORM],
	       (conv_flag[i] ? "y" : "n"));
    }
    
    interp_mixw(out_mixw,
		mixw_acc_a, mixw_acc_b, dnom,
		lambda, cilambda,
		ci_mixw, n_tied,
		n_cd_state, n_ci_state,
		n_mixw, n_feat, n_gau);

    return S3_SUCCESS;
}